

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
fasttext::Model::dfs
          (Model *this,int32_t k,real threshold,int32_t node,real score,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden)

{
  int32_t node_00;
  iterator __position;
  pointer pNVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  pair<float,_int> __value;
  undefined1 auVar3 [16];
  pointer ppVar4;
  long lVar5;
  undefined1 auVar6 [16];
  float fVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  _Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)> __cmp;
  pair<float,_int> local_50;
  real local_48;
  float local_44;
  ulong local_40;
  double local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_38 = (double)threshold + 1e-05;
  local_48 = threshold;
  dVar8 = ::log(local_38);
  if ((float)dVar8 <= score) {
    local_40 = (ulong)k;
    do {
      ppVar4 = (heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      __position._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (((long)__position._M_current - (long)ppVar4 >> 3 == local_40) && (score < ppVar4->first))
      {
        return;
      }
      lVar5 = (long)node;
      pNVar1 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pNVar1[lVar5].left == -1) && (pNVar1[lVar5].right == -1)) {
        local_50.second = node;
        local_50.first = score;
        if (__position._M_current ==
            (heap->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
          _M_realloc_insert<std::pair<float,int>>
                    ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,
                     __position,&local_50);
          ppVar4 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->first = score;
          (__position._M_current)->second = node;
          ppVar4 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        }
        _Var2._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        local_50 = (pair<float,_int>)comparePairs;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                  (_Var2,((long)ppVar4 - (long)_Var2._M_current >> 3) + -1,0,ppVar4[-1],
                   (_Iter_comp_val<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                    *)&local_50);
        _Var2._M_current =
             (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
        ppVar4 = (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)ppVar4 - (long)_Var2._M_current >> 3) <= local_40) {
          return;
        }
        if (8 < (long)ppVar4 - (long)_Var2._M_current) {
          __value = ppVar4[-1];
          ppVar4[-1].first = (_Var2._M_current)->first;
          ppVar4[-1].second = (_Var2._M_current)->second;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,std::pair<float,int>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>>
                    (_Var2,0,(long)ppVar4 + (-8 - (long)_Var2._M_current) >> 3,__value,
                     (_Iter_comp_iter<bool_(*)(const_std::pair<float,_int>_&,_const_std::pair<float,_int>_&)>
                      )comparePairs);
          ppVar4 = (heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = ppVar4 + -1;
        return;
      }
      if ((this->quant_ == true) &&
         (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          qout == true)) {
        auVar9._0_4_ = QMatrix::dotRow((this->qwo_).
                                       super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,hidden,lVar5 - this->osz_);
        auVar9._4_60_ = extraout_var;
        auVar6 = auVar9._0_16_;
      }
      else {
        auVar10._0_4_ =
             Matrix::dotRow((this->wo_).
                            super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            hidden,lVar5 - this->osz_);
        auVar10._4_60_ = extraout_var_00;
        auVar6 = auVar10._0_16_;
      }
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(auVar6,auVar3);
      fVar7 = expf(auVar6._0_4_);
      local_44 = 1.0 / (fVar7 + 1.0);
      node_00 = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5].left;
      dVar8 = ::log((double)(1.0 - local_44) + 1e-05);
      dfs(this,k,local_48,node_00,(float)dVar8 + score,heap,hidden);
      node = (this->tree).super__Vector_base<fasttext::Node,_std::allocator<fasttext::Node>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar5].right;
      dVar8 = ::log((double)local_44 + 1e-05);
      score = score + (float)dVar8;
      dVar8 = ::log(local_38);
    } while ((float)dVar8 <= score);
  }
  return;
}

Assistant:

void Model::dfs(int32_t k, real threshold, int32_t node, real score,
                std::vector<std::pair<real, int32_t>>& heap,
                Vector& hidden) const {
  if (score < std_log(threshold)) return;
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree[node].left == -1 && tree[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f;
  if (quant_ && args_->qout) {
    f= qwo_->dotRow(hidden, node - osz_);
  } else {
    f= wo_->dotRow(hidden, node - osz_);
  }
  f = 1. / (1 + std::exp(-f));

  dfs(k, threshold, tree[node].left, score + std_log(1.0 - f), heap, hidden);
  dfs(k, threshold, tree[node].right, score + std_log(f), heap, hidden);
}